

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O0

string * __thiscall
soul::CodeLocationRange::toString_abi_cxx11_(string *__return_storage_ptr__,CodeLocationRange *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  bool local_49;
  allocator<char> local_19;
  CodeLocationRange *local_18;
  CodeLocationRange *this_local;
  
  local_18 = this;
  this_local = (CodeLocationRange *)__return_storage_ptr__;
  bVar1 = RefCountedPtr<soul::SourceCodeText>::operator==
                    ((RefCountedPtr<soul::SourceCodeText> *)this,(SourceCodeText *)0x0);
  if (bVar1) {
    bVar1 = RefCountedPtr<soul::SourceCodeText>::operator==
                      (&(this->end).sourceCode,(SourceCodeText *)0x0);
    checkAssertion(bVar1,"end.sourceCode == nullptr","toString",0xe2);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    bVar1 = RefCountedPtr<soul::SourceCodeText>::operator!=
                      (&(this->end).sourceCode,(SourceCodeText *)0x0);
    local_49 = false;
    if (bVar1) {
      pcVar2 = UTF8Reader::getAddress(&(this->end).location);
      pcVar3 = UTF8Reader::getAddress(&(this->start).location);
      local_49 = pcVar3 <= pcVar2;
    }
    checkAssertion(local_49,
                   "end.sourceCode != nullptr && end.location.getAddress() >= start.location.getAddress()"
                   ,"toString",0xe6);
    pcVar2 = UTF8Reader::getAddress(&(this->start).location);
    pcVar3 = UTF8Reader::getAddress(&(this->end).location);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((string *)__return_storage_ptr__,pcVar2,pcVar3,&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CodeLocationRange::toString() const
{
    if (start.sourceCode == nullptr)
    {
        SOUL_ASSERT (end.sourceCode == nullptr);
        return {};
    }

    SOUL_ASSERT (end.sourceCode != nullptr && end.location.getAddress() >= start.location.getAddress());
    return std::string (start.location.getAddress(), end.location.getAddress());
}